

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Group.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Grouping_Transform(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var8;
  runtime_error *prVar9;
  aiVector3D *pValue;
  string *psVar10;
  int pAttrIdx;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  vector<float,_std::allocator<float>_> tvec;
  string def;
  string use;
  string an;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_148;
  aiVector3D local_138;
  vector<float,_std::allocator<float>_> local_128;
  float local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [16];
  aiVector3D local_e0;
  aiVector3D local_d0;
  float local_c4;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_138.z = 0.0;
  local_d0.x = 1.0;
  local_d0.y = 1.0;
  local_d0.z = 1.0;
  local_e0.x = 0.0;
  local_e0.y = 0.0;
  local_e0.z = 0.0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  uVar6 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar6 < 1) {
    local_198 = 0.0;
    fVar15 = 0.0;
    local_18c = 0.0;
    local_194 = 0.0;
    local_19c = 0.0;
    local_190 = 1.0;
    local_1a0 = 1.0;
    local_1a4 = 0.0;
  }
  else {
    uVar11 = 0;
    local_1a4 = 0.0;
    local_19c = 0.0;
    local_194 = 0.0;
    local_18c = 0.0;
    local_1a0 = 1.0;
    local_190 = 1.0;
    fVar15 = 0.0;
    local_198 = 0.0;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar11;
      iVar7 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar7),
                 (allocator<char> *)local_b0);
      iVar7 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar7 == 0) {
        iVar7 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar7);
        psVar10 = &local_90;
LAB_00628668:
        pcVar3 = (char *)psVar10->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar10,0,pcVar3,(ulong)__s);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar7 == 0) {
          iVar7 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar7);
          psVar10 = &local_70;
          goto LAB_00628668;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_50);
        if (((iVar7 != 0) && (iVar7 = std::__cxx11::string::compare((char *)&local_50), iVar7 != 0))
           && (iVar7 = std::__cxx11::string::compare((char *)&local_50), iVar7 != 0)) {
          iVar7 = std::__cxx11::string::compare((char *)&local_50);
          pValue = &local_138;
          if (iVar7 != 0) {
            iVar7 = std::__cxx11::string::compare((char *)&local_50);
            pValue = &local_d0;
            if (iVar7 != 0) {
              iVar7 = std::__cxx11::string::compare((char *)&local_50);
              pValue = &local_e0;
              if (iVar7 != 0) {
                iVar7 = std::__cxx11::string::compare((char *)&local_50);
                if (iVar7 == 0) {
                  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start = (float *)0x0;
                  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  XML_ReadNode_GetAttrVal_AsArrF(this,pAttrIdx,&local_128);
                  if ((long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start != 0x10) {
                    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_b0[0] = local_a0;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_b0,
                               "<Transform>: rotation vector must have 4 elements.","");
                    std::runtime_error::runtime_error(prVar9,(string *)local_b0);
                    *(undefined ***)prVar9 = &PTR__runtime_error_0080bf48;
                    __cxa_throw(prVar9,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  local_198 = *local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start;
                  local_19c = local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[1];
                  local_1a0 = local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[2];
                  local_1a4 = local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[3];
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)&local_50);
                  if (iVar7 != 0) {
                    Throw_IncorrectAttr(this,&local_50);
                    goto LAB_0062868d;
                  }
                  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start = (float *)0x0;
                  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  XML_ReadNode_GetAttrVal_AsArrF(this,pAttrIdx,&local_128);
                  if ((long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start != 0x10) {
                    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_b0[0] = local_a0;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_b0,
                               "<Transform>: scaleOrientation vector must have 4 elements.","");
                    std::runtime_error::runtime_error(prVar9,(string *)local_b0);
                    *(undefined ***)prVar9 = &PTR__runtime_error_0080bf48;
                    __cxa_throw(prVar9,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  local_194 = *local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start;
                  local_18c = local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[1];
                  local_190 = local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start[2];
                  fVar15 = local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[3];
                }
                operator_delete(local_128.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_128.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
                goto LAB_0062868d;
              }
            }
          }
          XML_ReadNode_GetAttrVal_AsVec3f(this,pAttrIdx,pValue);
        }
      }
LAB_0062868d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar11 = (ulong)(pAttrIdx + 1U);
    } while (uVar6 != pAttrIdx + 1U);
  }
  if (local_70._M_string_length == 0) {
    ParseHelper_Group_Begin(this,false);
    if (local_90._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&this->NodeElement_Cur->ID);
    }
    fVar16 = local_138.z * 0.0;
    fVar26 = local_138.x + local_138.y * 0.0 + fVar16 + local_e0.x;
    fVar31 = local_e0.x * 0.0 + 1.0;
    fVar27 = local_e0.x * 0.0 + 0.0;
    fVar22 = local_138.y + local_138.x * 0.0 + fVar16 + local_e0.y;
    fVar23 = local_e0.y * 0.0 + 0.0;
    local_f8._0_4_ = local_e0.y * 0.0 + 1.0;
    fVar20 = local_138.x * 0.0 + local_138.y * 0.0;
    local_108 = local_138.z + fVar20 + local_e0.z;
    fVar18 = local_e0.z * 0.0 + 0.0;
    fVar12 = local_e0.z * 0.0 + 1.0;
    fVar21 = fVar20 + fVar16 + 1.0;
    fVar16 = cosf(local_1a4);
    fVar20 = sinf(local_1a4);
    fVar25 = 1.0 - fVar16;
    fVar28 = local_198 * fVar25;
    fVar17 = fVar28 * local_19c - local_1a0 * fVar20;
    fVar19 = fVar28 * local_19c + local_1a0 * fVar20;
    fVar13 = fVar28 * local_1a0 + local_19c * fVar20;
    fVar29 = fVar28 * local_1a0 - local_19c * fVar20;
    fVar32 = local_19c * fVar25 * local_1a0;
    fVar14 = fVar32 - local_198 * fVar20;
    fVar32 = fVar32 + local_198 * fVar20;
    fVar28 = fVar28 * local_198 + fVar16;
    fVar24 = local_19c * local_19c * fVar25 + fVar16;
    fVar16 = fVar25 * local_1a0 * local_1a0 + fVar16;
    fVar25 = fVar26 * 0.0;
    local_b4 = fVar29 * fVar27 + fVar28 * fVar31 + fVar27 * fVar19 + fVar25;
    local_bc = fVar32 * fVar27 + fVar17 * fVar31 + fVar27 * fVar24 + fVar25;
    fVar25 = fVar16 * fVar27 + fVar13 * fVar31 + fVar27 * fVar14 + fVar25;
    fVar26 = fVar31 * 0.0 + fVar27 * 0.0 + fVar27 * 0.0 + fVar26;
    fVar27 = fVar22 * 0.0;
    fVar35 = fVar29 * fVar23 + fVar28 * fVar23 + (float)local_f8._0_4_ * fVar19 + fVar27;
    local_b8 = fVar32 * fVar23 + fVar17 * fVar23 + (float)local_f8._0_4_ * fVar24 + fVar27;
    fVar27 = fVar16 * fVar23 + fVar13 * fVar23 + (float)local_f8._0_4_ * fVar14 + fVar27;
    local_f8._0_4_ = (float)local_f8._0_4_ * 0.0 + fVar23 * 0.0 + fVar23 * 0.0 + fVar22;
    fVar22 = local_108 * 0.0;
    fVar36 = fVar29 * fVar12 + fVar28 * fVar18 + fVar18 * fVar19 + fVar22;
    fVar38 = fVar32 * fVar12 + fVar17 * fVar18 + fVar18 * fVar24 + fVar22;
    fVar22 = fVar16 * fVar12 + fVar13 * fVar18 + fVar18 * fVar14 + fVar22;
    fVar12 = fVar12 * 0.0 + fVar18 * 0.0 + fVar18 * 0.0 + local_108;
    fVar20 = fVar21 * 0.0;
    fVar30 = fVar29 * 0.0 + fVar28 * 0.0 + fVar19 * 0.0 + fVar20;
    fVar33 = fVar32 * 0.0 + fVar17 * 0.0 + fVar24 * 0.0 + fVar20;
    fVar24 = fVar16 * 0.0 + fVar13 * 0.0 + fVar14 * 0.0 + fVar20;
    fVar16 = cosf(fVar15);
    fVar13 = sinf(fVar15);
    fVar17 = 1.0 - fVar16;
    fVar18 = local_194 * fVar17;
    fVar34 = fVar18 * local_18c - local_190 * fVar13;
    fVar41 = fVar18 * local_18c + local_190 * fVar13;
    fVar23 = fVar18 * local_190 + local_18c * fVar13;
    fVar19 = fVar18 * local_190 - local_18c * fVar13;
    fVar39 = local_18c * fVar17 * local_190;
    fVar14 = fVar39 - fVar13 * local_194;
    fVar39 = fVar39 + fVar13 * local_194;
    fVar13 = fVar18 * local_194 + fVar16;
    fVar37 = local_18c * fVar17 * local_18c + fVar16;
    fVar16 = fVar17 * local_190 * local_190 + fVar16;
    local_c4 = fVar26 * 0.0;
    fVar40 = fVar19 * fVar25 + fVar13 * local_b4 + fVar41 * local_bc + local_c4;
    local_c0 = fVar39 * fVar25 + fVar34 * local_b4 + fVar37 * local_bc + local_c4;
    local_c4 = fVar16 * fVar25 + fVar23 * local_b4 + fVar14 * local_bc + local_c4;
    fVar26 = fVar25 * 0.0 + local_b4 * 0.0 + local_bc * 0.0 + fVar26;
    fVar29 = (float)local_f8._0_4_ * 0.0;
    fVar28 = fVar19 * fVar27 + fVar13 * fVar35 + fVar41 * local_b8 + fVar29;
    fVar31 = fVar39 * fVar27 + fVar34 * fVar35 + fVar37 * local_b8 + fVar29;
    fVar29 = fVar16 * fVar27 + fVar23 * fVar35 + fVar14 * local_b8 + fVar29;
    fVar18 = fVar27 * 0.0 + fVar35 * 0.0 + local_b8 * 0.0 + (float)local_f8._0_4_;
    fVar32 = fVar12 * 0.0;
    fVar17 = fVar19 * fVar22 + fVar13 * fVar36 + fVar41 * fVar38 + fVar32;
    fVar35 = fVar39 * fVar22 + fVar34 * fVar36 + fVar37 * fVar38 + fVar32;
    fVar32 = fVar16 * fVar22 + fVar23 * fVar36 + fVar14 * fVar38 + fVar32;
    fVar12 = fVar22 * 0.0 + fVar36 * 0.0 + fVar38 * 0.0 + fVar12;
    fVar36 = fVar19 * fVar24 + fVar13 * fVar30 + fVar41 * fVar33 + fVar20;
    fVar34 = fVar39 * fVar24 + fVar34 * fVar30 + fVar37 * fVar33 + fVar20;
    fVar20 = fVar16 * fVar24 + fVar23 * fVar30 + fVar14 * fVar33 + fVar20;
    fVar21 = fVar24 * 0.0 + fVar30 * 0.0 + fVar33 * 0.0 + fVar21;
    fVar16 = fVar40 * 0.0;
    fVar13 = fVar16 + local_c0 * 0.0;
    fVar14 = local_c4 * 0.0;
    fVar25 = fVar26 * 0.0;
    fVar23 = local_d0.x * fVar40 + local_c0 * 0.0 + fVar14 + fVar25;
    fVar16 = local_d0.y * local_c0 + fVar16 + fVar14 + fVar25;
    fVar25 = local_d0.z * local_c4 + fVar13 + fVar25;
    local_108 = fVar13 + fVar14 + fVar26;
    fVar26 = fVar31 * 0.0;
    fVar14 = fVar28 * 0.0;
    fVar19 = fVar14 + fVar26;
    fVar27 = fVar29 * 0.0;
    fVar13 = fVar18 * 0.0;
    fVar26 = local_d0.x * fVar28 + fVar26 + fVar27 + fVar13;
    fVar24 = local_d0.y * fVar31 + fVar14 + fVar27 + fVar13;
    fVar13 = local_d0.z * fVar29 + fVar19 + fVar13;
    fVar18 = fVar19 + fVar27 + fVar18;
    fVar19 = fVar35 * 0.0;
    fVar28 = fVar17 * 0.0;
    fVar27 = fVar28 + fVar19;
    fVar22 = fVar32 * 0.0;
    fVar14 = fVar12 * 0.0;
    fVar19 = local_d0.x * fVar17 + fVar19 + fVar22 + fVar14;
    fVar29 = local_d0.y * fVar35 + fVar28 + fVar22 + fVar14;
    fVar14 = local_d0.z * fVar32 + fVar27 + fVar14;
    fVar12 = fVar27 + fVar22 + fVar12;
    fVar27 = fVar34 * 0.0;
    fVar22 = fVar36 * 0.0;
    fVar30 = fVar22 + fVar27;
    fVar28 = fVar20 * 0.0;
    fVar17 = fVar21 * 0.0;
    fVar31 = local_d0.x * fVar36 + fVar27 + fVar28 + fVar17;
    fVar35 = local_d0.y * fVar34 + fVar22 + fVar28 + fVar17;
    fVar17 = local_d0.z * fVar20 + fVar30 + fVar17;
    fVar21 = fVar30 + fVar28 + fVar21;
    local_148 = -fVar15;
    local_f8._0_4_ = cosf(-fVar15);
    fVar15 = sinf(local_148);
    fVar28 = 1.0 - (float)local_f8._0_4_;
    fVar20 = local_194 * fVar28;
    fVar30 = fVar20 * local_18c - local_190 * fVar15;
    fVar36 = fVar20 * local_18c + local_190 * fVar15;
    fVar32 = fVar20 * local_190 + local_18c * fVar15;
    fVar37 = fVar20 * local_190 - local_18c * fVar15;
    fVar27 = local_18c * fVar28 * local_190;
    fVar34 = fVar27 - local_194 * fVar15;
    fVar27 = fVar27 + local_194 * fVar15;
    fVar33 = fVar20 * local_194 + (float)local_f8._0_4_;
    fVar22 = local_18c * local_18c * fVar28 + (float)local_f8._0_4_;
    fVar28 = fVar28 * local_190 * local_190 + (float)local_f8._0_4_;
    fVar15 = local_108 * 0.0;
    fVar39 = fVar37 * fVar25 + fVar33 * fVar23 + fVar36 * fVar16 + fVar15;
    fVar38 = fVar27 * fVar25 + fVar30 * fVar23 + fVar22 * fVar16 + fVar15;
    fVar15 = fVar28 * fVar25 + fVar32 * fVar23 + fVar34 * fVar16 + fVar15;
    local_f8 = ZEXT416((uint)fVar15);
    fVar16 = fVar25 * 0.0 + fVar23 * 0.0 + fVar16 * 0.0 + local_108;
    local_108 = fVar18 * 0.0;
    fVar40 = fVar37 * fVar13 + fVar33 * fVar26 + fVar36 * fVar24 + local_108;
    fVar25 = fVar27 * fVar13 + fVar30 * fVar26 + fVar22 * fVar24 + local_108;
    local_108 = fVar28 * fVar13 + fVar32 * fVar26 + fVar34 * fVar24 + local_108;
    uStack_104 = 0;
    uStack_100 = 0;
    uStack_fc = 0;
    fVar18 = fVar13 * 0.0 + fVar26 * 0.0 + fVar24 * 0.0 + fVar18;
    fVar20 = fVar12 * 0.0;
    fVar23 = fVar37 * fVar14 + fVar33 * fVar19 + fVar36 * fVar29 + fVar20;
    fVar24 = fVar27 * fVar14 + fVar30 * fVar19 + fVar22 * fVar29 + fVar20;
    fVar20 = fVar28 * fVar14 + fVar32 * fVar19 + fVar34 * fVar29 + fVar20;
    fVar12 = fVar14 * 0.0 + fVar19 * 0.0 + fVar29 * 0.0 + fVar12;
    fVar13 = fVar21 * 0.0;
    fVar19 = fVar37 * fVar17 + fVar33 * fVar31 + fVar36 * fVar35 + fVar13;
    fVar26 = fVar27 * fVar17 + fVar30 * fVar31 + fVar22 * fVar35 + fVar13;
    fVar13 = fVar28 * fVar17 + fVar32 * fVar31 + fVar34 * fVar35 + fVar13;
    fVar21 = fVar17 * 0.0 + fVar31 * 0.0 + fVar35 * 0.0 + fVar21;
    fVar17 = -local_138.x;
    fVar14 = fVar16 * 0.0;
    pCVar4 = this->NodeElement_Cur;
    pCVar4[1]._vptr_CX3DImporter_NodeElement =
         (_func_int **)
         CONCAT44(fVar14 + fVar15 * 0.0 + fVar39 * 0.0 + fVar38,
                  fVar14 + fVar15 * 0.0 + fVar39 + fVar38 * 0.0);
    pCVar4[1].Type = (EType)(fVar39 * 0.0 + fVar38 * 0.0 + fVar15 + fVar14);
    *(float *)&pCVar4[1].field_0xc =
         ((fVar17 * fVar39 - fVar38 * local_138.y) - local_138.z * fVar15) + fVar16;
    fVar15 = fVar18 * 0.0;
    pCVar4[1].ID._M_dataplus._M_p =
         (pointer)CONCAT44(fVar15 + local_108 * 0.0 + fVar40 * 0.0 + fVar25,
                           fVar15 + local_108 * 0.0 + fVar40 + fVar25 * 0.0);
    *(float *)&pCVar4[1].ID._M_string_length = fVar40 * 0.0 + fVar25 * 0.0 + local_108 + fVar15;
    *(float *)((long)&pCVar4[1].ID._M_string_length + 4) =
         ((fVar17 * fVar40 - fVar25 * local_138.y) - local_138.z * local_108) + fVar18;
    fVar15 = fVar12 * 0.0;
    pCVar4[1].ID.field_2._M_allocated_capacity =
         CONCAT44(fVar15 + fVar20 * 0.0 + fVar23 * 0.0 + fVar24,
                  fVar15 + fVar20 * 0.0 + fVar23 + fVar24 * 0.0);
    *(float *)((long)&pCVar4[1].ID.field_2 + 8) = fVar23 * 0.0 + fVar24 * 0.0 + fVar20 + fVar15;
    *(float *)((long)&pCVar4[1].ID.field_2 + 0xc) =
         ((fVar17 * fVar23 - fVar24 * local_138.y) - local_138.z * fVar20) + fVar12;
    fVar15 = fVar21 * 0.0;
    pCVar4[1].Parent =
         (CX3DImporter_NodeElement *)
         CONCAT44(fVar15 + fVar13 * 0.0 + fVar19 * 0.0 + fVar26,
                  fVar15 + fVar13 * 0.0 + fVar19 + fVar26 * 0.0);
    *(float *)&pCVar4[1].Child.
               super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
               ._M_impl._M_node.super__List_node_base._M_next =
         fVar19 * 0.0 + fVar26 * 0.0 + fVar13 + fVar15;
    *(float *)((long)&pCVar4[1].Child.
                      super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                      ._M_impl._M_node.super__List_node_base._M_next + 4) =
         ((fVar17 * fVar19 - fVar26 * local_138.y) - local_138.z * fVar13) + fVar21;
    iVar7 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar7 != '\0') {
      ParseHelper_Node_Exit(this);
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)0x0;
    XML_CheckNode_MustBeEmpty(this);
    if (local_90._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar5 = FindNodeElement(this,&local_70,ENET_Group,(CX3DImporter_NodeElement **)&local_50);
    if (!bVar5) {
      Throw_USE_NotFound(this,&local_70);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)local_50._M_dataplus._M_p;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar4->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Grouping_Transform()
{
    aiVector3D center(0, 0, 0);
    float rotation[4] = {0, 0, 1, 0};
    aiVector3D scale(1, 1, 1);// A value of zero indicates that any child geometry shall not be displayed
    float scale_orientation[4] = {0, 0, 1, 0};
    aiVector3D translation(0, 0, 0);
    aiMatrix4x4 matr, tmatr;
    std::string use, def;

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("center", center, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_REF("scale", scale, XML_ReadNode_GetAttrVal_AsVec3f);
		MACRO_ATTRREAD_CHECK_REF("translation", translation, XML_ReadNode_GetAttrVal_AsVec3f);
		if(an == "rotation")
		{
			std::vector<float> tvec;

			XML_ReadNode_GetAttrVal_AsArrF(idx, tvec);
			if(tvec.size() != 4) throw DeadlyImportError("<Transform>: rotation vector must have 4 elements.");

			memcpy(rotation, tvec.data(), sizeof(rotation));

			continue;
		}

		if(an == "scaleOrientation")
		{
			std::vector<float> tvec;
			XML_ReadNode_GetAttrVal_AsArrF(idx, tvec);
            if ( tvec.size() != 4 )
            {
                throw DeadlyImportError( "<Transform>: scaleOrientation vector must have 4 elements." );
            }

			::memcpy(scale_orientation, tvec.data(), sizeof(scale_orientation) );

			continue;
		}

	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		CX3DImporter_NodeElement* ne( nullptr );

		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Group, ne);
	}
	else
	{
		ParseHelper_Group_Begin();// create new grouping element and go deeper if node has children.
		// at this place new group mode created and made current, so we can name it.
        if ( !def.empty() )
        {
            NodeElement_Cur->ID = def;
        }

		//
		// also set values specific to this type of group
		//
		// calculate transformation matrix
		aiMatrix4x4::Translation(translation, matr);// T
		aiMatrix4x4::Translation(center, tmatr);// C
		matr *= tmatr;
		aiMatrix4x4::Rotation(rotation[3], aiVector3D(rotation[0], rotation[1], rotation[2]), tmatr);// R
		matr *= tmatr;
		aiMatrix4x4::Rotation(scale_orientation[3], aiVector3D(scale_orientation[0], scale_orientation[1], scale_orientation[2]), tmatr);// SR
		matr *= tmatr;
		aiMatrix4x4::Scaling(scale, tmatr);// S
		matr *= tmatr;
		aiMatrix4x4::Rotation(-scale_orientation[3], aiVector3D(scale_orientation[0], scale_orientation[1], scale_orientation[2]), tmatr);// -SR
		matr *= tmatr;
		aiMatrix4x4::Translation(-center, tmatr);// -C
		matr *= tmatr;
		// and assign it
		((CX3DImporter_NodeElement_Group*)NodeElement_Cur)->Transformation = matr;
		// in grouping set of nodes check X3DMetadataObject is not needed, because it is done in <Scene> parser function.

		// for empty element exit from node in that place
        if ( mReader->isEmptyElement() )
        {
            ParseHelper_Node_Exit();
        }
	}// if(!use.empty()) else
}